

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v2.cc
# Opt level: O0

void __thiscall
lf::io::(anonymous_namespace)::
MshGrammarText<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::ErrorHandler::
operator()(ErrorHandler *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          param_3,info *what)

{
  size_type sVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_61;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined1 local_50 [8];
  string input;
  info *what_local;
  ErrorHandler *this_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  param_3_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_local;
  
  local_60._M_current = last._M_current;
  local_58._M_current = first._M_current;
  input.field_2._8_8_ = what;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)local_50,local_58,local_60,&local_61);
  std::allocator<char>::~allocator(&local_61);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  if (0x28 < sVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,0,0x28)
    ;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               &local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Error in MshFile! Expecting ");
  pbVar3 = boost::spirit::operator<<(poVar2,what);
  poVar2 = std::operator<<(pbVar3," here: \"");
  poVar2 = std::operator<<(poVar2,(string *)local_50);
  poVar2 = std::operator<<(poVar2,"\"");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void operator()(FIRST first, LAST last, ERROR_POS /*errorPos*/,
                    WHAT what) const {
      std::string input(first, last);
      if (input.length() > 40) {
        input = input.substr(0, 40);
      }
      std::cout << "Error in MshFile! Expecting " << what << " here: \""
                << input << "\"" << std::endl;
    }